

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::RWLocker::LockForWriting(RWLocker *this)

{
  int iVar1;
  
  if (this->writing_ != false) {
    return;
  }
  iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)this->mu_);
  if ((iVar1 == 0) && (iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)this->mu_), iVar1 == 0)) {
    this->writing_ = true;
    return;
  }
  abort();
}

Assistant:

void DFA::RWLocker::LockForWriting() NO_THREAD_SAFETY_ANALYSIS {
  if (!writing_) {
    mu_->ReaderUnlock();
    mu_->Lock();
    writing_ = true;
  }
}